

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  U32 UVar1;
  U32 UVar2;
  ulong uVar3;
  uint local_88;
  uint local_84;
  U32 s_1;
  U32 s;
  U32 c;
  U32 cached;
  U32 *Counting4;
  U32 *Counting3;
  U32 *Counting2;
  U32 *Counting1;
  uint max;
  uint maxSymbolValue;
  BYTE *iend;
  BYTE *ip;
  U32 *workSpace_local;
  HIST_checkInput_e check_local;
  size_t sourceSize_local;
  void *source_local;
  uint *maxSymbolValuePtr_local;
  uint *count_local;
  
  Counting1._4_4_ = *maxSymbolValuePtr;
  Counting1._0_4_ = 0;
  memset(workSpace,0,0x1000);
  if (sourceSize == 0) {
    memset(count,0,(ulong)(Counting1._4_4_ + 1));
    *maxSymbolValuePtr = 0;
    count_local = (uint *)0x0;
  }
  else {
    if (Counting1._4_4_ == 0) {
      Counting1._4_4_ = 0xff;
    }
    s = MEM_read32(source);
    iend = (BYTE *)((long)source + 4);
    while (iend < (BYTE *)((long)source + sourceSize) + -0xf) {
      UVar1 = MEM_read32(iend);
      workSpace[s & 0xff] = workSpace[s & 0xff] + 1;
      uVar3 = (ulong)(s >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(s >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(s >> 0x18) + 0x300] = workSpace[(ulong)(s >> 0x18) + 0x300] + 1;
      UVar2 = MEM_read32(iend + 4);
      workSpace[UVar1 & 0xff] = workSpace[UVar1 & 0xff] + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar1 >> 0x18) + 0x300] = workSpace[(ulong)(UVar1 >> 0x18) + 0x300] + 1;
      UVar1 = MEM_read32(iend + 8);
      workSpace[UVar2 & 0xff] = workSpace[UVar2 & 0xff] + 1;
      uVar3 = (ulong)(UVar2 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar2 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar2 >> 0x18) + 0x300] = workSpace[(ulong)(UVar2 >> 0x18) + 0x300] + 1;
      s = MEM_read32(iend + 0xc);
      iend = iend + 0x10;
      workSpace[UVar1 & 0xff] = workSpace[UVar1 & 0xff] + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar1 >> 0x18) + 0x300] = workSpace[(ulong)(UVar1 >> 0x18) + 0x300] + 1;
    }
    iend = iend + -4;
    while (iend < (BYTE *)((long)source + sourceSize)) {
      workSpace[*iend] = workSpace[*iend] + 1;
      iend = iend + 1;
    }
    if (check != trustInput) {
      for (local_84 = 0xff; Counting1._4_4_ < local_84; local_84 = local_84 - 1) {
        workSpace[local_84] =
             workSpace[(ulong)local_84 + 0x100] + workSpace[(ulong)local_84 + 0x200] +
             workSpace[(ulong)local_84 + 0x300] + workSpace[local_84];
        if (workSpace[local_84] != 0) {
          return 0xffffffffffffffd0;
        }
      }
    }
    if (0xff < Counting1._4_4_) {
      Counting1._4_4_ = 0xff;
    }
    for (local_88 = 0; local_88 <= Counting1._4_4_; local_88 = local_88 + 1) {
      count[local_88] =
           workSpace[local_88] + workSpace[(ulong)local_88 + 0x100] +
           workSpace[(ulong)local_88 + 0x200] + workSpace[(ulong)local_88 + 0x300];
      if ((uint)Counting1 < count[local_88]) {
        Counting1._0_4_ = count[local_88];
      }
    }
    for (; count[Counting1._4_4_] == 0; Counting1._4_4_ = Counting1._4_4_ - 1) {
    }
    *maxSymbolValuePtr = Counting1._4_4_;
    count_local = (uint *)(ulong)(uint)Counting1;
  }
  return (size_t)count_local;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* safety checks */
    if (!sourceSize) {
        memset(count, 0, maxSymbolValue + 1);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    if (!maxSymbolValue) maxSymbolValue = 255;            /* 0 == default */

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    if (check) {   /* verify stats will fit into destination table */
        U32 s; for (s=255; s>maxSymbolValue; s--) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s]) return ERROR(maxSymbolValue_tooSmall);
    }   }

    {   U32 s;
        if (maxSymbolValue > 255) maxSymbolValue = 255;
        for (s=0; s<=maxSymbolValue; s++) {
            count[s] = Counting1[s] + Counting2[s] + Counting3[s] + Counting4[s];
            if (count[s] > max) max = count[s];
    }   }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;
    return (size_t)max;
}